

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * str_hasnextword(char *buffer,char *word)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  ushort *puVar4;
  ushort **ppuVar5;
  __int32_t **pp_Var6;
  char *pcVar7;
  
  if (buffer != (char *)0x0) {
    ppuVar5 = __ctype_b_loc();
    puVar4 = *ppuVar5;
    pcVar7 = buffer + -2;
    do {
      pcVar1 = pcVar7 + 2;
      pcVar7 = pcVar7 + 1;
    } while ((puVar4[*pcVar1] & 1) != 0);
    while( true ) {
      cVar2 = *word;
      cVar3 = pcVar7[1];
      if ((long)cVar2 == 0) break;
      if (cVar3 == '\0') {
        return (char *)0x0;
      }
      if ((puVar4[cVar3] & 1) != 0) {
        return (char *)0x0;
      }
      pp_Var6 = __ctype_tolower_loc();
      if ((*pp_Var6)[cVar2] != (*pp_Var6)[cVar3]) {
        return (char *)0x0;
      }
      word = word + 1;
      pcVar7 = pcVar7 + 1;
    }
    if ((cVar3 == '\0') || ((puVar4[cVar3] & 1) != 0)) {
      do {
        pcVar1 = pcVar7 + 1;
        pcVar7 = pcVar7 + 1;
      } while ((puVar4[*pcVar1] & 1) != 0);
      return pcVar7;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
str_hasnextword(const char *buffer, const char *word) {
  /* sanity check */
  if (buffer == NULL) {
    return NULL;
  }

  /* skip whitespace prefix */
  while (isblank(*buffer)) {
    buffer++;
  }

  while (*word != 0 && *buffer != 0 && !isblank(*buffer) && tolower(*word) == tolower(*buffer)) {
    word++;
    buffer++;
  }

  /* complete match ? */
  if (*word == 0 && (*buffer == 0 || isblank(*buffer))) {
    while (isblank(*buffer)) {
      buffer++;
    }
    return buffer;
  }
  return NULL;
}